

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O2

void __thiscall cppcms::archive_error::archive_error(archive_error *this,string *e)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"cppcms::archive_error: ",e);
  booster::runtime_error::runtime_error(&this->super_runtime_error,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_002b7b40;
  (this->super_runtime_error).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__archive_error_002b7b68;
  return;
}

Assistant:

archive_error(std::string const &e) : booster::runtime_error("cppcms::archive_error: " + e)
		{
		}